

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

String * __thiscall
nigel::Token::toString_abi_cxx11_(String *__return_storage_ptr__,Token *this,bool extended)

{
  char *pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 local_48 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  switch(this->type) {
  case eof:
    pcVar1 = "_!EOF!_";
    break;
  case ppEnd:
    pcVar1 = "PP-END";
    break;
  default:
    pcVar1 = "-!-UNKNOWN-!-";
    break;
  case function:
    pcVar1 = "fn";
    break;
  case type_byte:
    pcVar1 = "byte";
    break;
  case type_int:
    pcVar1 = "int";
    break;
  case unsigned_attr:
    pcVar1 = "unsigned";
    break;
  case fast_attr:
    pcVar1 = "fast";
    break;
  case norm_attr:
    pcVar1 = "norm";
    break;
  case type_ptr:
    pcVar1 = "ptr";
    break;
  case cf_if:
    pcVar1 = "if";
    break;
  case cf_else:
    pcVar1 = "else";
    break;
  case cf_while:
    pcVar1 = "while";
    break;
  case cf_for:
    pcVar1 = "for";
    break;
  case cf_do:
    pcVar1 = "do";
    break;
  case cf_break:
    pcVar1 = "break";
    break;
  case cf_return:
    pcVar1 = "return";
    break;
  case dy_new:
    pcVar1 = "new";
    break;
  case dy_delete:
    pcVar1 = "delete";
    break;
  case literalTrue:
    pcVar1 = "true";
    break;
  case literalFalse:
    pcVar1 = "false";
    break;
  case operatorToken:
    as<nigel::Token_Operator>((Token *)local_48);
    pcVar1 = "";
    if (extended) {
      pcVar1 = "\t\tas unknown operator";
    }
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_48._0_8_ + 0x50),pcVar1);
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8);
    goto LAB_0017c722;
  case op_add:
    pcVar1 = "+";
    break;
  case op_sub:
    pcVar1 = "-";
    break;
  case op_mul:
    pcVar1 = "*";
    break;
  case op_div:
    pcVar1 = "/";
    break;
  case op_mod:
    pcVar1 = "%";
    break;
  case op_eql:
    pcVar1 = "==";
    break;
  case op_not_eql:
    pcVar1 = "!=";
    break;
  case op_less:
    pcVar1 = "<";
    break;
  case op_more:
    pcVar1 = ">";
    break;
  case op_less_eql:
    pcVar1 = "<=";
    break;
  case op_more_eql:
    pcVar1 = ">=";
    break;
  case op_shift_left:
    pcVar1 = "<<";
    break;
  case op_shift_right:
    pcVar1 = ">>";
    break;
  case op_not:
    pcVar1 = "!";
    break;
  case op_and:
    pcVar1 = "&";
    break;
  case op_and_log:
    pcVar1 = "&&";
    break;
  case op_or:
    pcVar1 = "|";
    break;
  case op_or_log:
    pcVar1 = "||";
    break;
  case op_xor:
    pcVar1 = "^";
    break;
  case op_inv:
    pcVar1 = "~";
    break;
  case op_set:
    pcVar1 = "=";
    break;
  case op_add_set:
    pcVar1 = "+=";
    break;
  case op_sub_set:
    pcVar1 = "-=";
    break;
  case op_mul_set:
    pcVar1 = "*=";
    break;
  case op_div_set:
    pcVar1 = "/=";
    break;
  case op_mod_set:
    pcVar1 = "%=";
    break;
  case op_shift_left_set:
    pcVar1 = "<<=";
    break;
  case op_shift_right_set:
    pcVar1 = ">>=";
    break;
  case op_and_set:
    pcVar1 = "&=";
    break;
  case op_or_set:
    pcVar1 = "|=";
    break;
  case op_xor_set:
    pcVar1 = "^=";
    break;
  case op_inc:
    pcVar1 = "++";
    break;
  case op_dec:
    pcVar1 = "--";
    break;
  case dividingToken:
    as<nigel::Token_DividingToken>((Token *)(local_48 + 0x20));
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_48,'\x01');
    pcVar1 = "";
    if (extended) {
      pcVar1 = "\t\tas unknown divider token";
    }
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   pcVar1);
    std::__cxx11::string::~string((string *)local_48);
    this_00 = &local_20;
LAB_0017c722:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    return __return_storage_ptr__;
  case tok_dollar:
    pcVar1 = "$";
    break;
  case tok_hash:
    pcVar1 = "#";
    break;
  case tok_parenthesis_open:
    pcVar1 = "(";
    break;
  case tok_parenthesis_close:
    pcVar1 = ")";
    break;
  case tok_bracket_open:
    pcVar1 = "[";
    break;
  case tok_bracket_close:
    pcVar1 = "]";
    break;
  case tok_brace_open:
    pcVar1 = "{";
    break;
  case tok_brace_close:
    pcVar1 = "}";
    break;
  case tok_comma:
    pcVar1 = ",";
    break;
  case tok_period:
    pcVar1 = ".";
    break;
  case tok_colon:
    pcVar1 = ":";
    break;
  case tok_semicolon:
    pcVar1 = ";";
    break;
  case tok_questionmark:
    pcVar1 = "?";
    break;
  case tok_at:
    pcVar1 = "@";
    break;
  case tok_backslash:
    pcVar1 = "\\";
    break;
  case tok_grave:
    pcVar1 = "`";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)local_48);
  return __return_storage_ptr__;
}

Assistant:

String Token::toString( bool extended ) const
	{
		if( type == Token::Type::eof ) return "_!EOF!_";
		else if( type == Token::Type::ppEnd ) return "PP-END";
		else if( type == Token::Type::function ) return "fn";
		else if( type == Token::Type::type_byte ) return "byte";
		else if( type == Token::Type::type_int ) return "int";
		else if( type == Token::Type::unsigned_attr ) return "unsigned";
		else if( type == Token::Type::fast_attr ) return "fast";
		else if( type == Token::Type::norm_attr ) return "norm";
		else if( type == Token::Type::type_ptr ) return "ptr";
		else if( type == Token::Type::cf_if ) return "if";
		else if( type == Token::Type::cf_else ) return "else";
		else if( type == Token::Type::cf_while ) return "while";
		else if( type == Token::Type::cf_for ) return "for";
		else if( type == Token::Type::cf_do ) return "do";
		else if( type == Token::Type::cf_return ) return "return";
		else if( type == Token::Type::cf_break ) return "break";
		else if( type == Token::Type::dy_new ) return "new";
		else if( type == Token::Type::dy_delete ) return "delete";
		else if( type == Token::Type::literalTrue ) return "true";
		else if( type == Token::Type::literalFalse ) return "false";
		else if( type == Token::Type::operatorToken ) return as<Token_Operator>()->operatorToken + ( extended ? "\t\tas unknown operator" : "" );
		else if( type == Token::Type::op_add ) return "+";
		else if( type == Token::Type::op_sub ) return "-";
		else if( type == Token::Type::op_mul ) return "*";
		else if( type == Token::Type::op_div ) return "/";
		else if( type == Token::Type::op_mod ) return "%";
		else if( type == Token::Type::op_add_set ) return "+=";
		else if( type == Token::Type::op_sub_set ) return "-=";
		else if( type == Token::Type::op_mul_set ) return "*=";
		else if( type == Token::Type::op_div_set ) return "/=";
		else if( type == Token::Type::op_mod_set ) return "%=";
		else if( type == Token::Type::op_set ) return "=";
		else if( type == Token::Type::op_eql ) return "==";
		else if( type == Token::Type::op_not_eql ) return "!=";
		else if( type == Token::Type::op_more ) return ">";
		else if( type == Token::Type::op_less ) return "<";
		else if( type == Token::Type::op_more_eql ) return ">=";
		else if( type == Token::Type::op_less_eql ) return "<=";
		else if( type == Token::Type::op_shift_left ) return "<<";
		else if( type == Token::Type::op_shift_right ) return ">>";
		else if( type == Token::Type::op_shift_left_set ) return "<<=";
		else if( type == Token::Type::op_shift_right_set ) return ">>=";
		else if( type == Token::Type::op_not ) return "!";
		else if( type == Token::Type::op_and ) return "&";
		else if( type == Token::Type::op_and_set ) return "&=";
		else if( type == Token::Type::op_and_log ) return "&&";
		else if( type == Token::Type::op_or ) return "|";
		else if( type == Token::Type::op_or_set ) return "|=";
		else if( type == Token::Type::op_or_log ) return "||";
		else if( type == Token::Type::op_xor ) return "^";
		else if( type == Token::Type::op_xor_set ) return "^=";
		else if( type == Token::Type::op_inv ) return "~";
		else if( type == Token::Type::op_inc ) return "++";
		else if( type == Token::Type::op_dec ) return "--";
		else if( type == Token::Type::dividingToken ) return String( 1, as<Token_DividingToken>()->token ) + ( extended ? "\t\tas unknown divider token" : "" );
		else if( type == Token::Type::tok_dollar ) return "$";
		else if( type == Token::Type::tok_hash ) return "#";
		else if( type == Token::Type::tok_parenthesis_open ) return "(";
		else if( type == Token::Type::tok_parenthesis_close ) return ")";
		else if( type == Token::Type::tok_bracket_open ) return "[";
		else if( type == Token::Type::tok_bracket_close ) return "]";
		else if( type == Token::Type::tok_brace_open ) return "{";
		else if( type == Token::Type::tok_brace_close ) return "}";
		else if( type == Token::Type::tok_comma ) return ",";
		else if( type == Token::Type::tok_period ) return ".";
		else if( type == Token::Type::tok_colon ) return ":";
		else if( type == Token::Type::tok_semicolon ) return ";";
		else if( type == Token::Type::tok_questionmark ) return "?";
		else if( type == Token::Type::tok_at ) return "@";
		else if( type == Token::Type::tok_backslash ) return "\\";
		else if( type == Token::Type::tok_grave ) return "`";
		else return "-!-UNKNOWN-!-";
	}